

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_SINCOS(Context *ctx)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  char local_1e8 [8];
  char scratch [64];
  int need_cos;
  int need_sin;
  char src0_2 [64];
  char dst_2 [64];
  char src0_1 [64];
  char dst_1 [64];
  char src0 [64];
  char dst [64];
  int mask;
  Context *ctx_local;
  
  iVar2 = (ctx->dest_arg).writemask;
  iVar1 = shader_is_pixel(ctx);
  if ((iVar1 == 0) && (ctx->profile_supports_nv4 == 0)) {
    if (ctx->profile_supports_nv2 == 0) {
      get_ARB1_destarg_varname(ctx,src0_2 + 0x38,0x40);
      get_ARB1_srcarg_varname(ctx,0,(char *)&need_cos,0x40);
      iVar1 = writemask_x(iVar2);
      bVar3 = true;
      if (iVar1 == 0) {
        iVar1 = writemask_xy(iVar2);
        bVar3 = iVar1 != 0;
      }
      iVar1 = writemask_y(iVar2);
      bVar4 = true;
      if (iVar1 == 0) {
        iVar2 = writemask_xy(iVar2);
        bVar4 = iVar2 != 0;
      }
      if ((bVar3) || (bVar4)) {
        allocate_ARB1_scratch_reg_name(ctx,local_1e8,0x40);
      }
      if (bVar3) {
        output_line(ctx,"ABS %s.x, %s.x;",src0_2 + 0x38,&need_cos);
        output_line(ctx,"MUL %s.x, %s.x, -0.40528473456935108577551785283891;",src0_2 + 0x38,
                    src0_2 + 0x38);
        output_line(ctx,"MUL %s.x, %s.x, 1.2732395447351626861510701069801;",local_1e8,&need_cos);
        output_line(ctx,"MAD %s.x, %s.x, %s.x, %s.x;",src0_2 + 0x38,src0_2 + 0x38,&need_cos,
                    local_1e8);
      }
      if (bVar4) {
        output_line(ctx,"ADD %s.x, %s.x, 1.57079637050628662109375;",local_1e8,&need_cos);
        output_line(ctx,"SGE %s.y, %s.x, 3.1415927410125732421875;",local_1e8,local_1e8);
        output_line(ctx,"MAD %s.x, %s.y, -6.283185482025146484375, %s.x;",local_1e8,local_1e8,
                    local_1e8);
        output_line(ctx,"ABS %s.x, %s.x;",src0_2 + 0x38,&need_cos);
        output_line(ctx,"MUL %s.x, %s.x, -0.40528473456935108577551785283891;",src0_2 + 0x38,
                    src0_2 + 0x38);
        output_line(ctx,"MUL %s.x, %s.x, 1.2732395447351626861510701069801;",local_1e8,&need_cos);
        output_line(ctx,"MAD %s.y, %s.x, %s.x, %s.x;",src0_2 + 0x38,src0_2 + 0x38,&need_cos,
                    local_1e8);
      }
    }
    else {
      get_ARB1_destarg_varname(ctx,src0_1 + 0x38,0x40);
      make_ARB1_srcarg_string(ctx,0,dst_2 + 0x38,0x40);
      iVar1 = writemask_x(iVar2);
      if (iVar1 == 0) {
        iVar1 = writemask_y(iVar2);
        if (iVar1 == 0) {
          iVar2 = writemask_xy(iVar2);
          if (iVar2 != 0) {
            output_line(ctx,"SIN %s.x, %s;",src0_1 + 0x38,dst_2 + 0x38);
            output_line(ctx,"COS %s.y, %s;",src0_1 + 0x38,dst_2 + 0x38);
          }
        }
        else {
          output_line(ctx,"SIN %s.y, %s;",src0_1 + 0x38,dst_2 + 0x38);
        }
      }
      else {
        output_line(ctx,"COS %s.x, %s;",src0_1 + 0x38,dst_2 + 0x38);
      }
    }
  }
  else {
    make_ARB1_destarg_string(ctx,src0 + 0x38,0x40);
    make_ARB1_srcarg_string(ctx,0,dst_1 + 0x38,0x40);
    iVar1 = writemask_x(iVar2);
    if (iVar1 == 0) {
      iVar1 = writemask_y(iVar2);
      if (iVar1 == 0) {
        iVar2 = writemask_xy(iVar2);
        if (iVar2 != 0) {
          output_line(ctx,"SCS%s, %s;",src0 + 0x38,dst_1 + 0x38);
        }
      }
      else {
        output_line(ctx,"SIN%s, %s;",src0 + 0x38,dst_1 + 0x38);
      }
    }
    else {
      output_line(ctx,"COS%s, %s;",src0 + 0x38,dst_1 + 0x38);
    }
  }
  iVar2 = isfail(ctx);
  if (iVar2 == 0) {
    emit_ARB1_dest_modifiers(ctx);
  }
  return;
}

Assistant:

static void emit_ARB1_SINCOS(Context *ctx)
{
    // we don't care about the temp registers that <= sm2 demands; ignore them.
    const int mask = ctx->dest_arg.writemask;

    // arb1 fragment programs and everything nv4 have sin/cos/sincos opcodes.
    if ((shader_is_pixel(ctx)) || (support_nv4(ctx)))
    {
        char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
        if (writemask_x(mask))
            output_line(ctx, "COS%s, %s;", dst, src0);
        else if (writemask_y(mask))
            output_line(ctx, "SIN%s, %s;", dst, src0);
        else if (writemask_xy(mask))
            output_line(ctx, "SCS%s, %s;", dst, src0);
    } // if

    // nv2+ profiles have sin and cos opcodes.
    else if (support_nv2(ctx))
    {
        char dst[64]; get_ARB1_destarg_varname(ctx, dst, sizeof (dst));
        char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
        if (writemask_x(mask))
            output_line(ctx, "COS %s.x, %s;", dst, src0);
        else if (writemask_y(mask))
            output_line(ctx, "SIN %s.y, %s;", dst, src0);
        else if (writemask_xy(mask))
        {
            output_line(ctx, "SIN %s.x, %s;", dst, src0);
            output_line(ctx, "COS %s.y, %s;", dst, src0);
        } // else if
    } // if

    else  // big nasty.
    {
        char dst[64]; get_ARB1_destarg_varname(ctx, dst, sizeof (dst));
        char src0[64]; get_ARB1_srcarg_varname(ctx, 0, src0, sizeof (src0));
        const int need_sin = (writemask_x(mask) || writemask_xy(mask));
        const int need_cos = (writemask_y(mask) || writemask_xy(mask));
        char scratch[64];

        if (need_sin || need_cos)
            allocate_ARB1_scratch_reg_name(ctx, scratch, sizeof (scratch));

        // These sin() and cos() approximations originally found here:
        //    http://www.devmaster.net/forums/showthread.php?t=5784
        //
        // const float B = 4.0f / M_PI;
        // const float C = -4.0f / (M_PI * M_PI);
        // float y = B * x + C * x * fabs(x);
        //
        // // optional better precision...
        // const float P = 0.225f;
        // y = P * (y * fabs(y) - y) + y;
        //
        //
        // That first thing can be reduced to:
        // const float y = ((1.2732395447351626861510701069801f * x) +
        //             ((-0.40528473456935108577551785283891f * x) * fabs(x)));

        if (need_sin)
        {
            // !!! FIXME: use SRCMOD_ABS here?
            output_line(ctx, "ABS %s.x, %s.x;", dst, src0);
            output_line(ctx, "MUL %s.x, %s.x, -0.40528473456935108577551785283891;", dst, dst);
            output_line(ctx, "MUL %s.x, %s.x, 1.2732395447351626861510701069801;", scratch, src0);
            output_line(ctx, "MAD %s.x, %s.x, %s.x, %s.x;", dst, dst, src0, scratch);
        } // if

        // cosine is sin(x + M_PI/2), but you have to wrap x to pi:
        //  if (x+(M_PI/2) > M_PI)
        //      x -= 2 * M_PI;
        //
        // which is...
        //  if (x+(1.57079637050628662109375) > 3.1415927410125732421875)
        //      x += -6.283185482025146484375;

        if (need_cos)
        {
            output_line(ctx, "ADD %s.x, %s.x, 1.57079637050628662109375;", scratch, src0);
            output_line(ctx, "SGE %s.y, %s.x, 3.1415927410125732421875;", scratch, scratch);
            output_line(ctx, "MAD %s.x, %s.y, -6.283185482025146484375, %s.x;", scratch, scratch, scratch);
            output_line(ctx, "ABS %s.x, %s.x;", dst, src0);
            output_line(ctx, "MUL %s.x, %s.x, -0.40528473456935108577551785283891;", dst, dst);
            output_line(ctx, "MUL %s.x, %s.x, 1.2732395447351626861510701069801;", scratch, src0);
            output_line(ctx, "MAD %s.y, %s.x, %s.x, %s.x;", dst, dst, src0, scratch);
        } // if
    } // else

    // !!! FIXME: might not have done anything. Don't emit if we didn't.
    if (!isfail(ctx))
        emit_ARB1_dest_modifiers(ctx);
}